

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O0

Quat<double> * __thiscall
Imath_2_5::Quat<double>::setRotation(Quat<double> *this,Vec3<double> *from,Vec3<double> *to)

{
  Quat<double> *in_RDI;
  double dVar1;
  Vec3<double> f02;
  Quat<double> q;
  Vec3<double> h0;
  Vec3<double> t0;
  Vec3<double> f0;
  Vec3<double> *in_stack_fffffffffffffe68;
  Vec3<double> *in_stack_fffffffffffffe78;
  Vec3<double> *in_stack_fffffffffffffe88;
  Quat<double> *in_stack_fffffffffffffea8;
  Vec3<double> *in_stack_fffffffffffffeb0;
  Vec3<double> *in_stack_fffffffffffffeb8;
  Quat<double> *in_stack_fffffffffffffec0;
  Quat<double> *in_stack_fffffffffffffef8;
  Quat<double> *in_stack_ffffffffffffff00;
  Vec3<double> local_f8 [2];
  Vec3<double> local_c8;
  double local_b0;
  double local_a8;
  double local_a0;
  
  Vec3<double>::normalized(in_stack_fffffffffffffe88);
  Vec3<double>::normalized(in_stack_fffffffffffffe88);
  dVar1 = Vec3<double>::operator^((Vec3<double> *)in_RDI,in_stack_fffffffffffffe68);
  if (dVar1 < 0.0) {
    Vec3<double>::operator+(in_stack_fffffffffffffe78,(Vec3<double> *)in_RDI);
    Vec3<double>::normalized(in_stack_fffffffffffffe88);
    dVar1 = Vec3<double>::operator^((Vec3<double> *)in_RDI,in_stack_fffffffffffffe68);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      setRotationInternal(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                          in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      Quat((Quat<double> *)0x170c8f);
      setRotationInternal(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                          in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      operator*=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    else {
      in_RDI->r = 0.0;
      Vec3<double>::operator*(in_stack_fffffffffffffe78,(Vec3<double> *)in_RDI);
      if ((local_a8 < local_b0) || (local_a0 < local_b0)) {
        if (local_a0 < local_a8) {
          Vec3<double>::Vec3((Vec3<double> *)&stack0xfffffffffffffe78,0.0,0.0,1.0);
          Vec3<double>::operator%(in_stack_fffffffffffffe78,(Vec3<double> *)in_RDI);
          Vec3<double>::normalized(in_stack_fffffffffffffe88);
          Vec3<double>::operator=(&in_RDI->v,(Vec3<double> *)&stack0xfffffffffffffea8);
        }
        else {
          Vec3<double>::Vec3((Vec3<double> *)&stack0xfffffffffffffec0,0.0,1.0,0.0);
          Vec3<double>::operator%(in_stack_fffffffffffffe78,(Vec3<double> *)in_RDI);
          Vec3<double>::normalized(in_stack_fffffffffffffe88);
          Vec3<double>::operator=(&in_RDI->v,(Vec3<double> *)&stack0xfffffffffffffef0);
        }
      }
      else {
        Vec3<double>::Vec3(local_f8,1.0,0.0,0.0);
        Vec3<double>::operator%(in_stack_fffffffffffffe78,(Vec3<double> *)in_RDI);
        Vec3<double>::normalized(in_stack_fffffffffffffe88);
        Vec3<double>::operator=(&in_RDI->v,&local_c8);
      }
    }
  }
  else {
    setRotationInternal(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                        in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  return in_RDI;
}

Assistant:

Quat<T> &
Quat<T>::setRotation (const Vec3<T> &from, const Vec3<T> &to)
{
    //
    // Create a quaternion that rotates vector from into vector to,
    // such that the rotation is around an axis that is the cross
    // product of from and to.
    //
    // This function calls function setRotationInternal(), which is
    // numerically accurate only for rotation angles that are not much
    // greater than pi/2.  In order to achieve good accuracy for angles
    // greater than pi/2, we split large angles in half, and rotate in
    // two steps.
    //

    //
    // Normalize from and to, yielding f0 and t0.
    //

    Vec3<T> f0 = from.normalized();
    Vec3<T> t0 = to.normalized();

    if ((f0 ^ t0) >= 0)
    {
	//
	// The rotation angle is less than or equal to pi/2.
	//

	setRotationInternal (f0, t0, *this);
    }
    else
    {
	//
	// The angle is greater than pi/2.  After computing h0,
	// which is halfway between f0 and t0, we rotate first
	// from f0 to h0, then from h0 to t0.
	//

	Vec3<T> h0 = (f0 + t0).normalized();

	if ((h0 ^ h0) != 0)
	{
	    setRotationInternal (f0, h0, *this);

	    Quat<T> q;
	    setRotationInternal (h0, t0, q);

	    *this *= q;
	}
	else
	{
	    //
	    // f0 and t0 point in exactly opposite directions.
	    // Pick an arbitrary axis that is orthogonal to f0,
	    // and rotate by pi.
	    //

	    r = T (0);

	    Vec3<T> f02 = f0 * f0;

	    if (f02.x <= f02.y && f02.x <= f02.z)
		v = (f0 % Vec3<T> (1, 0, 0)).normalized();
	    else if (f02.y <= f02.z)
		v = (f0 % Vec3<T> (0, 1, 0)).normalized();
	    else
		v = (f0 % Vec3<T> (0, 0, 1)).normalized();
	}
    }

    return *this;
}